

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this)

{
  StrWriter *this_local;
  
  if (this->style->syntax - MOIRA_MIT < 3) {
    operator<<(this,"w");
  }
  else {
    operator<<(this,".w");
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Sz<S>)
{
    switch (style.syntax) {

        case Syntax::MOIRA_MIT:
       case Syntax::GNU:
        case Syntax::GNU_MIT:

            *this << ((S == Byte) ? "b" : (S == Word) ? "w" : "l");
            break;

        default:

            *this << ((S == Byte) ? ".b" : (S == Word) ? ".w" : ".l");
    }

    return *this;
}